

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::value_type::destroy<std::__cxx11::string>(value_type *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  pbVar2 = as<std::__cxx11::string>(this);
  pcVar1 = (pbVar2->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &pbVar2->field_2) {
    operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
  }
  this->yytypeid_ = (type_info *)0x0;
  return;
}

Assistant:

void
    destroy ()
    {
      as<T> ().~T ();
      yytypeid_ = YY_NULLPTR;
    }